

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_set.cpp
# Opt level: O0

void __thiscall
SetFixture_InsertSingleLeaf_Test::~SetFixture_InsertSingleLeaf_Test
          (SetFixture_InsertSingleLeaf_Test *this)

{
  SetFixture_InsertSingleLeaf_Test *this_local;
  
  ~SetFixture_InsertSingleLeaf_Test(this);
  operator_delete(this,400);
  return;
}

Assistant:

TEST_F (SetFixture, InsertSingleLeaf) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    std::pair<iterator, bool> itp = index_.insert (t1, "a"s);
    std::string const & key = (*itp.first);
    EXPECT_EQ ("a", key);
    EXPECT_TRUE (itp.second);
    itp = index_.insert (t1, "a"s);
    EXPECT_FALSE (itp.second);
    EXPECT_EQ (1U, index_.size ());
}